

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.h
# Opt level: O3

void __thiscall
TPZMultiphysicsElement::TPZMultiphysicsElement
          (TPZMultiphysicsElement *this,void **vtt,TPZCompMesh *mesh,TPZGeoEl *ref)

{
  void *pvVar1;
  
  TPZCompEl::TPZCompEl(&this->super_TPZCompEl,vtt + 1,mesh,ref);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fActiveApproxSpace).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x60) =
       vtt[3];
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<int>::TPZVec(&(this->fActiveApproxSpace).super_TPZVec<int>,0);
  (this->fActiveApproxSpace).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fActiveApproxSpace).super_TPZVec<int>.fStore = (this->fActiveApproxSpace).fExtAlloc;
  (this->fActiveApproxSpace).super_TPZVec<int>.fNElements = 0;
  (this->fActiveApproxSpace).super_TPZVec<int>.fNAlloc = 0;
  return;
}

Assistant:

TPZMultiphysicsElement(TPZCompMesh &mesh, TPZGeoEl *ref) : TPZCompEl(mesh, ref)
	{
	}